

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_alloc_helpers.hpp
# Opt level: O0

void asio_handler_alloc_helpers::
     deallocate<ableton::util::SafeAsyncHandler<ableton::platforms::asio::AsioTimer::AsyncHandler>>
               (void *p,size_t s,
               SafeAsyncHandler<ableton::platforms::asio::AsioTimer::AsyncHandler> *h)

{
  SafeAsyncHandler<ableton::platforms::asio::AsioTimer::AsyncHandler> *h_local;
  size_t s_local;
  void *p_local;
  
  ::asio::asio_handler_deallocate(p,s,h);
  return;
}

Assistant:

inline void deallocate(void* p, std::size_t s, Handler& h)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  ::operator delete(p);
#else
  using asio::asio_handler_deallocate;
  asio_handler_deallocate(p, s, asio::detail::addressof(h));
#endif
}